

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbp.cpp
# Opt level: O0

void __thiscall merlin::lbp::run(lbp *this)

{
  bool bVar1;
  ulong uVar2;
  Type TVar3;
  uint uVar4;
  _Setw _Var5;
  _Setprecision _Var6;
  int iVar7;
  size_t sVar8;
  ostream *poVar9;
  edge_id *peVar10;
  reference pvVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference F2;
  double *pdVar12;
  undefined4 extraout_var_01;
  size_type sVar13;
  undefined4 extraout_var_02;
  void *pvVar14;
  reference pvVar15;
  double dVar16;
  double __x;
  double __x_00;
  value vVar17;
  undefined1 auVar18 [16];
  ulong local_2e0;
  size_t i;
  ulong local_2c0;
  size_t j;
  variable VX;
  size_t v;
  factor local_280;
  factor local_220;
  ulong local_1c0;
  size_t f_1;
  double local_1b0;
  ulong local_1a8;
  size_t e;
  factor local_190;
  factor local_120;
  undefined1 local_c0 [8];
  factor logF;
  index local_58;
  size_type local_50;
  size_t n;
  size_t f;
  size_t print;
  size_t iter;
  double dMsg;
  double dObj;
  ulong uStack_18;
  bool ok;
  size_t stopIter;
  lbp *this_local;
  
  stopIter = (size_t)this;
  (*(this->super_algorithm)._vptr_algorithm[2])();
  dVar16 = (this->super_algorithm).m_stop_iter;
  sVar8 = graphical_model::num_factors(&(this->super_factor_graph).super_graphical_model);
  auVar18._8_4_ = (int)(sVar8 >> 0x20);
  auVar18._0_8_ = sVar8;
  auVar18._12_4_ = 0x45300000;
  dVar16 = dVar16 * ((auVar18._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0));
  uStack_18 = (ulong)dVar16;
  uStack_18 = uStack_18 | (long)(dVar16 - 9.223372036854776e+18) & (long)uStack_18 >> 0x3f;
  dObj._7_1_ = 1;
  dMsg = (this->super_algorithm).m_stop_obj + 1.0;
  iter = (size_t)((this->super_algorithm).m_stop_msg + 1.0);
  print = 0;
  f = 1;
  local_50 = 0;
  poVar9 = std::operator<<((ostream *)&std::cout,"[LBP] Begin message passing over factor graph ..."
                          );
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  while( true ) {
    bVar1 = false;
    if (((this->super_algorithm).m_stop_msg <= (double)iter) && (bVar1 = false, print < uStack_18))
    {
      bVar1 = (this->super_algorithm).m_stop_obj <= dMsg;
    }
    if (!bVar1) goto LAB_0021e8d5;
    TVar3 = Schedule::operator_cast_to_Type(&this->m_sched);
    if (TVar3 == Priority) {
      join_0x00000000_0x00001200_ = indexed_heap::top(&this->m_priority);
      peVar10 = graph::edge(&(this->super_factor_graph).super_graphical_model.super_graph,local_58);
      n = peVar10->second;
      indexed_heap::pop(&this->m_priority);
    }
    else {
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&this->m_forder,local_50);
      n = *pvVar11;
      local_50 = local_50 + 1;
      sVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_forder);
      if (local_50 == sVar13) {
        local_50 = 0;
      }
    }
    TVar3 = Schedule::operator_cast_to_Type(&this->m_sched);
    if (TVar3 != Flood) {
      graphical_model::get_factor(&(this->super_factor_graph).super_graphical_model,n);
      log((merlin *)local_c0,__x);
      dMsg = 0.0;
      iVar7 = (*(this->super_algorithm)._vptr_algorithm[10])(this,n);
      factor::operator*(&local_120,(factor *)CONCAT44(extraout_var,iVar7),(factor *)local_c0);
      vVar17 = factor::sum(&local_120);
      dVar16 = obj_entropy(this,n);
      dMsg = dMsg - (vVar17 + dVar16);
      factor::~factor(&local_120);
      accept_incoming(this,n);
      iVar7 = (*(this->super_algorithm)._vptr_algorithm[10])(this,n);
      factor::operator*(&local_190,(factor *)CONCAT44(extraout_var_00,iVar7),(factor *)local_c0);
      vVar17 = factor::sum(&local_190);
      dVar16 = obj_entropy(this,n);
      dMsg = vVar17 + dVar16 + dMsg;
      this->m_logz = dMsg + this->m_logz;
      factor::~factor(&local_190);
      factor::~factor((factor *)local_c0);
    }
    update_outgoing(this,n);
    TVar3 = Schedule::operator_cast_to_Type(&this->m_sched);
    if (TVar3 == Priority) {
      _e = indexed_heap::top(&this->m_priority);
      iter = e;
    }
    else if ((0.0 < (this->super_algorithm).m_stop_msg) && (local_50 == 0)) {
      iter = 0;
      for (local_1a8 = 0; uVar2 = local_1a8,
          sVar8 = graph::num_edges(&(this->super_factor_graph).super_graphical_model.super_graph),
          uVar2 < sVar8 << 1; local_1a8 = local_1a8 + 1) {
        pvVar15 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                            (&this->m_msg_new,local_1a8);
        F2 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                       (&this->m_msg,local_1a8);
        f_1._4_4_ = (this->m_dist).t_;
        local_1b0 = factor::distance(pvVar15,F2,f_1._4_4_);
        pdVar12 = std::max<double>((double *)&iter,&local_1b0);
        iter = (size_t)*pdVar12;
      }
    }
    TVar3 = Schedule::operator_cast_to_Type(&this->m_sched);
    if ((TVar3 == Flood) && (local_50 == 0)) {
      dMsg = this->m_logz;
      this->m_logz = 0.0;
      for (local_1c0 = 0; uVar2 = local_1c0,
          sVar8 = graphical_model::num_factors(&(this->super_factor_graph).super_graphical_model),
          uVar2 < sVar8; local_1c0 = local_1c0 + 1) {
        accept_incoming(this,local_1c0);
        iVar7 = (*(this->super_algorithm)._vptr_algorithm[10])(this,local_1c0);
        graphical_model::get_factor(&(this->super_factor_graph).super_graphical_model,local_1c0);
        log((merlin *)&local_280,__x_00);
        factor::operator*(&local_220,(factor *)CONCAT44(extraout_var_01,iVar7),&local_280);
        vVar17 = factor::sum(&local_220);
        dVar16 = obj_entropy(this,local_1c0);
        this->m_logz = vVar17 + dVar16 + this->m_logz;
        factor::~factor(&local_220);
        factor::~factor(&local_280);
      }
      dMsg = dMsg - this->m_logz;
    }
    uVar4 = std::isnan(this->m_logz);
    if (((uVar4 & 1) != 0) || (uVar4 = std::isinf(this->m_logz), (uVar4 & 1) != 0)) break;
    sVar8 = graphical_model::num_factors(&(this->super_factor_graph).super_graphical_model);
    if (f * sVar8 < print) {
      f = f + 1;
      poVar9 = std::operator<<((ostream *)&std::cout,"  logZ: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
      _Var5 = std::setw(0xc);
      poVar9 = std::operator<<(poVar9,_Var5);
      _Var6 = std::setprecision(6);
      poVar9 = std::operator<<(poVar9,_Var6);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_logz);
      poVar9 = std::operator<<(poVar9," (");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::scientific);
      _Var6 = std::setprecision(6);
      poVar9 = std::operator<<(poVar9,_Var6);
      dVar16 = exp(this->m_logz);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar16);
      std::operator<<(poVar9,") ");
      poVar9 = std::operator<<((ostream *)&std::cout,"\td=");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::scientific);
      _Var6 = std::setprecision(6);
      poVar9 = std::operator<<(poVar9,_Var6);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,dMsg);
      poVar9 = std::operator<<(poVar9,"\tm=");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(double)iter);
      poVar9 = std::operator<<(poVar9,"\t time=");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
      _Var6 = std::setprecision(6);
      poVar9 = std::operator<<(poVar9,_Var6);
      dVar16 = timeSystem();
      poVar9 = (ostream *)
               std::ostream::operator<<(poVar9,dVar16 - (this->super_algorithm).m_start_time);
      poVar9 = std::operator<<(poVar9,"\ti=");
      pvVar14 = (void *)std::ostream::operator<<(poVar9,print);
      std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
    }
    print = print + 1;
  }
  dObj._7_1_ = 0;
LAB_0021e8d5:
  poVar9 = std::operator<<((ostream *)&std::cout,"[LBP] Converged after ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,print);
  poVar9 = std::operator<<(poVar9," iterations in ");
  dVar16 = timeSystem();
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar16 - (this->super_algorithm).m_start_time)
  ;
  poVar9 = std::operator<<(poVar9," seconds");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"PR");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
  _Var6 = std::setprecision(6);
  poVar9 = std::operator<<(poVar9,_Var6);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->m_logz);
  poVar9 = std::operator<<(poVar9," (");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::scientific);
  _Var6 = std::setprecision(6);
  poVar9 = std::operator<<(poVar9,_Var6);
  dVar16 = exp(this->m_logz);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar16);
  poVar9 = std::operator<<(poVar9,")");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  if ((dObj._7_1_ & 1) == 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"STATUS");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<((ostream *)&std::cout,"false: Inconsistent evidence or underflow");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar9 = std::operator<<((ostream *)&std::cout,"STATUS");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<((ostream *)&std::cout,"true: Consistent evidence");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  poVar9 = std::operator<<((ostream *)&std::cout,"MAR");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  sVar8 = graphical_model::nvar(&(this->super_factor_graph).super_graphical_model);
  std::ostream::operator<<(&std::cout,sVar8);
  for (VX.m_states = 0; sVar8 = VX.m_states,
      sVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         (&(this->super_factor_graph).m_vindex), sVar8 < sVar13;
      VX.m_states = VX.m_states + 1) {
    _j = graphical_model::var(&(this->super_factor_graph).super_graphical_model,VX.m_states);
    poVar9 = std::operator<<((ostream *)&std::cout," ");
    sVar8 = variable::states((variable *)&j);
    std::ostream::operator<<(poVar9,sVar8);
    for (local_2c0 = 0; sVar8 = variable::states((variable *)&j), local_2c0 < sVar8;
        local_2c0 = local_2c0 + 1) {
      poVar9 = std::operator<<((ostream *)&std::cout," ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
      _Var6 = std::setprecision(6);
      poVar9 = std::operator<<(poVar9,_Var6);
      iVar7 = (*(this->super_algorithm)._vptr_algorithm[0xb])(this,j,VX.m_label);
      vVar17 = factor::operator[]((factor *)CONCAT44(extraout_var_02,iVar7),local_2c0);
      std::ostream::operator<<(poVar9,vVar17);
    }
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  if ((this->m_debug & 1U) != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Final log partition function is ");
    pvVar14 = (void *)std::ostream::operator<<(poVar9,this->m_logz);
    std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"Final (normalized) beliefs\n");
    for (local_2e0 = 0;
        sVar13 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::size
                           (&this->m_beliefs), local_2e0 < sVar13; local_2e0 = local_2e0 + 1) {
      pvVar15 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                          (&this->m_beliefs,local_2e0);
      poVar9 = merlin::operator<<((ostream *)&std::cout,pvVar15);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void lbp::run() {

	init();

	// it's easier to count updates than "iterations"
	size_t stopIter = m_stop_iter * num_factors();

	bool ok = true;
	double dObj = m_stop_obj + 1.0, dMsg = m_stop_msg + 1.0;// initialize termination values
	size_t iter = 0, print = 1; // count updates and "iterations" for printing
	size_t f, n = 0;

	std::cout << "[LBP] Begin message passing over factor graph ..." << std::endl;
	for (; dMsg >= m_stop_msg && iter < stopIter && dObj >= m_stop_obj;) {

		if (m_sched == Schedule::Priority) { // priority schedule =>
			f = edge(m_priority.top().second).second; // get next factor for update from queue
			m_priority.pop();
		} else { // fixed schedule =>
			f = m_forder[n]; // get next factor from list
			if (++n == m_forder.size()) {
				n = 0; // loop over to the beginning of the fixed order
			}
		}

		if (m_sched != Schedule::Flood) {// For non-"flood" schedules,
			factor logF = log(get_factor(f));
			dObj = 0.0; // compute new belief and update objective:
			dObj -= (belief(f) * logF).sum() + obj_entropy(f); //   remove old contribution
			accept_incoming(f); //   accept all messages into factor f
			m_logz += dObj += (belief(f) * logF).sum() + obj_entropy(f); //   re-add new contribution
		}
		update_outgoing(f);		//   update outgoing messages from factor f

		if (m_sched == Schedule::Priority) {
			dMsg = m_priority.top().first; // priority schedule => easy to check msg stop
		} else if (m_stop_msg > 0 && n == 0) { // else check once each time through all factors
			dMsg = 0.0;
			for (size_t e = 0; e < 2 * num_edges(); ++e) {
				dMsg = std::max(dMsg, m_msg_new[e].distance(m_msg[e], m_dist));
			}
		}

		if (m_sched == Schedule::Flood && n == 0) { // for flooding schedules, recalculate all
			dObj = m_logz;
			m_logz = 0.0; //   the beliefs and objective now
			for (size_t f = 0; f < num_factors(); ++f) {
				accept_incoming(f);
				m_logz += (belief(f) * log(get_factor(f))).sum() + obj_entropy(f);
			}
			dObj -= m_logz;
		}

		// check if NaN or -inf
		if (isnan(m_logz) || isinf(m_logz)) {
			ok = false;
			break;
		}

		if (iter > print * num_factors()) {
			print++;
			std::cout << "  logZ: " << std::fixed << std::setw(12)
				<< std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ") ";
			std::cout << "\td=" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< dObj << "\tm=" << dMsg << "\t time="  << std::fixed
				<< std::setprecision(MERLIN_PRECISION)
				<< (timeSystem() - m_start_time)
				<< "\ti=" << iter << std::endl;
		}

		iter++;
	}

	// Output solution (UAI output format)
	std::cout << "[LBP] Converged after " << iter << " iterations in "
		<< (timeSystem() - m_start_time) << " seconds" << std::endl;
	std::cout << "PR" << std::endl;
	std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
		<< m_logz << " (" << std::scientific
		<< std::setprecision(MERLIN_PRECISION)
		<< std::exp(m_logz) << ")" << std::endl;
	if (!ok) {
		std::cout << "STATUS" << std::endl;
		std::cout << "false: Inconsistent evidence or underflow" << std::endl;
	} else {
		std::cout << "STATUS" << std::endl;
		std::cout << "true: Consistent evidence" << std::endl;
	}
	std::cout << "MAR" << std::endl;
	std::cout << nvar();
	for (size_t v = 0; v < m_vindex.size(); ++v) {
		variable VX = var(v);
		std::cout << " " << VX.states();
		for (size_t j = 0; j < VX.states(); ++j) {
			std::cout << " " << std::fixed
				<< std::setprecision(MERLIN_PRECISION) << belief(VX)[j];
		}
	}
	std::cout << std::endl;

	if (m_debug) {
		std::cout << "Final log partition function is " << m_logz << std::endl;
		std::cout << "Final (normalized) beliefs\n";
		for (size_t i = 0; i < m_beliefs.size(); ++i) {
			std::cout << m_beliefs[i] << std::endl;
		}
	}
}